

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::MessageParseError::MessageParseError(MessageParseError *this,string *what)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Could not parse message",&local_39);
  Exception::Exception(&this->super_Exception,&local_38,what);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__Exception_003227b8;
  return;
}

Assistant:

MessageParseError( const std::string& what = "" )
    : Exception( "Could not parse message", what ) {}